

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

bool __thiscall Js::FunctionBody::DoInterpreterProfileWithLock(FunctionBody *this)

{
  uint sourceContextId;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  sourceContextId =
       ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->m_srcInfo
          ).ptr)->sourceContextInfo).ptr)->sourceContextId;
  if ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015bbe90,InterpreterProfilePhase,sourceContextId,
                            ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                            ptr)->functionId);
  if (bVar2) {
    return false;
  }
  bVar2 = DynamicProfileInfo::IsEnabled(this);
  return bVar2;
}

Assistant:

bool FunctionBody::DoInterpreterProfileWithLock() const
    {
#if ENABLE_PROFILE_INFO
        return !PHASE_OFF(InterpreterProfilePhase, this) && DynamicProfileInfo::IsEnabled(this);
#else
        return false;
#endif
    }